

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_conn.c
# Opt level: O2

_Bool csp_conn_is_active(csp_conn_t *conn)

{
  uint32_t uVar1;
  bool bVar2;
  
  if ((((conn->idin).flags & 2) == 0) && (((conn->idout).flags & 2) == 0)) {
    return true;
  }
  uVar1 = csp_get_ms();
  bVar2 = -1 < (int)((conn->timestamp - uVar1) + (conn->rdp).conn_timeout);
  if ((!bVar2) && (csp_dbg_rdp_print != '\0')) {
    csp_print_func("\x1b[31mRDP %p: Timeout no packets received last %u ms\n\x1b[0m",conn);
  }
  return ((conn->rdp).state & ~RDP_CLOSE_WAIT) != RDP_CLOSED && bVar2;
}

Assistant:

bool csp_conn_is_active(csp_conn_t *conn) {
#if (CSP_USE_RDP)
	if ((conn->idin.flags & CSP_FRDP) || (conn->idout.flags & CSP_FRDP)) {
		/* This is for sure an RDP connection */
		return csp_rdp_conn_is_active(conn);
	}
#endif

	/* Non RDP connections are always "active" */
	return true;
}